

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_nonblock_begin(nk_context *ctx,nk_flags flags,nk_rect body,nk_rect header,
                     nk_panel_type panel_type)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  nk_window *pnVar4;
  nk_size nVar5;
  bool bVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  nk_buffer *pnVar11;
  nk_handle nVar12;
  nk_size nVar13;
  nk_size nVar14;
  int iVar15;
  nk_page_element *pnVar16;
  nk_page_element *ptr;
  nk_panel *pnVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  nk_rect r;
  
  fVar19 = header.x;
  fVar20 = header.y;
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x420c,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  pnVar17 = pnVar4->layout;
  if (pnVar17 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x420d,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if ((pnVar17->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
      NK_PANEL_NONE) {
    __assert_fail("!(panel->type & NK_PANEL_SET_POPUP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4214,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  pnVar16 = (nk_page_element *)(pnVar4->popup).win;
  if (pnVar16 == (nk_page_element *)0x0) {
    pnVar16 = nk_create_page_element(ctx);
    (pnVar16->data).tbl.seq = ctx->seq;
    (pnVar16->data).win.parent = pnVar4;
    (pnVar4->popup).win = (nk_window *)pnVar16;
    (pnVar4->popup).type = panel_type;
    (pnVar16->data).win.buffer.base = &ctx->memory;
    (pnVar16->data).tbl.keys[0x1e] = 1;
    nVar5 = (ctx->memory).allocated;
    (pnVar16->data).win.buffer.begin = nVar5;
    (pnVar16->data).win.buffer.end = nVar5;
    (pnVar16->data).win.buffer.last = nVar5;
  }
  else {
    bVar6 = true;
    bVar18 = true;
    if ((ctx->input).mouse.buttons[0].down == 0) {
      bVar18 = (ctx->input).mouse.buttons[0].clicked == 0;
    }
    fVar2 = (ctx->input).mouse.pos.x;
    if ((body.x <= fVar2) && (fVar2 < body.x + body.w)) {
      fVar3 = (ctx->input).mouse.pos.y;
      if (body.y <= fVar3) {
        bVar6 = body.y + body.h <= fVar3;
      }
    }
    bVar7 = false;
    if ((fVar19 <= fVar2) && (bVar7 = false, fVar2 < fVar19 + header.w)) {
      fVar2 = (ctx->input).mouse.pos.y;
      if (fVar20 <= fVar2) {
        bVar7 = fVar2 < fVar20 + header.h;
      }
      else {
        bVar7 = false;
      }
    }
    if (!bVar18) {
      (pnVar4->popup).header = header;
      if ((bool)(bVar6 | bVar7)) {
        do {
          pbVar1 = (byte *)((long)&pnVar17->flags + 2);
          *pbVar1 = *pbVar1 | 1;
          pnVar17 = pnVar17->parent;
        } while (pnVar17 != (nk_panel *)0x0);
        return 0;
      }
      goto LAB_00118655;
    }
  }
  (pnVar4->popup).header.x = fVar19;
  (pnVar4->popup).header.y = fVar20;
  (pnVar4->popup).header.w = header.w;
  (pnVar4->popup).header.h = header.h;
LAB_00118655:
  *(long *)((long)&pnVar16->data + 0x4c) = body._0_8_;
  *(long *)((long)&pnVar16->data + 0x54) = body._8_8_;
  (pnVar16->data).win.parent = pnVar4;
  ptr = nk_create_page_element(ctx);
  nk_zero(ptr,0x200);
  (pnVar16->data).win.layout = (nk_panel *)ptr;
  (pnVar16->data).tbl.keys[0x10] = flags | 0x801;
  (pnVar16->data).tbl.seq = ctx->seq;
  (pnVar4->popup).active = 1;
  if (ptr != (nk_page_element *)0x0) {
    uVar8 = (undefined4)(pnVar4->buffer).end;
    uVar9 = *(undefined4 *)((long)&(pnVar4->buffer).end + 4);
    nVar5 = (pnVar4->buffer).last;
    uVar10 = *(undefined4 *)((long)&(pnVar4->buffer).last + 4);
    *(undefined4 *)&(pnVar4->popup).buf.begin = uVar8;
    *(undefined4 *)((long)&(pnVar4->popup).buf.begin + 4) = uVar9;
    *(int *)&(pnVar4->popup).buf.parent = (int)nVar5;
    *(undefined4 *)((long)&(pnVar4->popup).buf.parent + 4) = uVar10;
    *(undefined4 *)&(pnVar4->popup).buf.last = uVar8;
    *(undefined4 *)((long)&(pnVar4->popup).buf.last + 4) = uVar9;
    *(undefined4 *)&(pnVar4->popup).buf.end = uVar8;
    *(undefined4 *)((long)&(pnVar4->popup).buf.end + 4) = uVar9;
    (pnVar4->popup).buf.active = 1;
    pnVar11 = (pnVar4->buffer).base;
    fVar2 = (pnVar4->buffer).clip.x;
    fVar3 = (pnVar4->buffer).clip.y;
    fVar19 = (pnVar4->buffer).clip.w;
    fVar20 = (pnVar4->buffer).clip.h;
    iVar15 = (pnVar4->buffer).use_clipping;
    uVar8 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar12 = (pnVar4->buffer).userdata;
    nVar5 = (pnVar4->buffer).begin;
    nVar13 = (pnVar4->buffer).last;
    (pnVar16->data).win.buffer.end = (pnVar4->buffer).end;
    (pnVar16->data).win.buffer.last = nVar13;
    (pnVar16->data).win.buffer.userdata = nVar12;
    (pnVar16->data).win.buffer.begin = nVar5;
    *(float *)((long)&pnVar16->data + 0x78) = fVar19;
    *(float *)((long)&pnVar16->data + 0x7c) = fVar20;
    *(int *)((long)&pnVar16->data + 0x80) = iVar15;
    *(undefined4 *)((long)&pnVar16->data + 0x84) = uVar8;
    (pnVar16->data).win.buffer.base = pnVar11;
    *(float *)((long)&pnVar16->data + 0x70) = fVar2;
    *(float *)((long)&pnVar16->data + 0x74) = fVar3;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&(pnVar16->data).win.buffer,r);
    ctx->current = (nk_window *)pnVar16;
    nk_panel_begin(ctx,(char *)0x0,panel_type);
    fVar19 = *(float *)((long)&pnVar16->data + 0x70);
    fVar20 = *(float *)((long)&pnVar16->data + 0x74);
    fVar2 = *(float *)((long)&pnVar16->data + 0x78);
    fVar3 = *(float *)((long)&pnVar16->data + 0x7c);
    iVar15 = *(int *)((long)&pnVar16->data + 0x80);
    uVar8 = *(undefined4 *)((long)&pnVar16->data + 0x84);
    nVar12 = (pnVar16->data).win.buffer.userdata;
    nVar5 = (pnVar16->data).win.buffer.begin;
    nVar13 = (pnVar16->data).win.buffer.end;
    nVar14 = (pnVar16->data).win.buffer.last;
    (pnVar4->buffer).base = (pnVar16->data).win.buffer.base;
    (pnVar4->buffer).clip.x = fVar19;
    (pnVar4->buffer).clip.y = fVar20;
    (pnVar4->buffer).clip.w = fVar2;
    (pnVar4->buffer).clip.h = fVar3;
    (pnVar4->buffer).use_clipping = iVar15;
    *(undefined4 *)&(pnVar4->buffer).field_0x1c = uVar8;
    (pnVar4->buffer).userdata = nVar12;
    (pnVar4->buffer).begin = nVar5;
    (pnVar4->buffer).end = nVar13;
    (pnVar4->buffer).last = nVar14;
    pnVar17 = (pnVar16->data).win.layout;
    pnVar17->parent = pnVar4->layout;
    pnVar17->offset_x = (nk_uint *)((long)&pnVar16->data + 0x5c);
    pnVar17->offset_y = (nk_uint *)((long)&pnVar16->data + 0x60);
    for (pnVar17 = pnVar4->layout; pnVar17 != (nk_panel *)0x0; pnVar17 = pnVar17->parent) {
      pbVar1 = (byte *)((long)&pnVar17->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    return 1;
  }
  __assert_fail("popup->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x423e,
                "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
               );
}

Assistant:

NK_LIB int
nk_nonblock_begin(struct nk_context *ctx,
    nk_flags flags, struct nk_rect body, struct nk_rect header,
    enum nk_panel_type panel_type)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;
    int is_active = nk_true;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* popups cannot have popups */
    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP));
    (void)panel;
    popup = win->popup.win;
    if (!popup) {
        /* create window for nonblocking popup */
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.type = panel_type;
        nk_command_buffer_init(&popup->buffer, &ctx->memory, NK_CLIPPING_ON);
    } else {
        /* close the popup if user pressed outside or in the header */
        int pressed, in_body, in_header;
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
        pressed = nk_input_is_mouse_released(&ctx->input, NK_BUTTON_LEFT);
#else
        pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
#endif
        in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        in_header = nk_input_is_mouse_hovering_rect(&ctx->input, header);
        if (pressed && (!in_body || in_header))
            is_active = nk_false;
    }
    win->popup.header = header;

    if (!is_active) {
        /* remove read only mode from all parent panels */
        struct nk_panel *root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        return is_active;
    }
    popup->bounds = body;
    popup->parent = win;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    popup->flags |= NK_WINDOW_DYNAMIC;
    popup->seq = ctx->seq;
    win->popup.active = 1;
    NK_ASSERT(popup->layout);

    nk_start_popup(ctx, win);
    popup->buffer = win->buffer;
    nk_push_scissor(&popup->buffer, nk_null_rect);
    ctx->current = popup;

    nk_panel_begin(ctx, 0, panel_type);
    win->buffer = popup->buffer;
    popup->layout->parent = win->layout;
    popup->layout->offset_x = &popup->scrollbar.x;
    popup->layout->offset_y = &popup->scrollbar.y;

    /* set read only mode to all parent panels */
    {struct nk_panel *root;
    root = win->layout;
    while (root) {
        root->flags |= NK_WINDOW_ROM;
        root = root->parent;
    }}
    return is_active;
}